

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main0(void)

{
  uint uVar1;
  pointer piVar2;
  uint *puVar3;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  allocator_type local_a9;
  vector<int,_std::allocator<int>_> src;
  vector<int,_std::allocator<int>_> del;
  BTree tree;
  Record *r;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  tree.root_ = (BTNode *)0x0;
  tree.size_ = 0;
  local_48 = 0x3400000032;
  uStack_40 = 0x1e00000017;
  local_58 = 0xf;
  uStack_54 = 0x30;
  uStack_50 = 0x2d;
  uStack_4c = 0x2f;
  r = (Record *)0x1f00000012;
  uStack_60 = 0xc;
  uStack_5c = 10;
  local_38 = 0x14;
  __l._M_len = 0xd;
  __l._M_array = (iterator)&r;
  std::vector<int,_std::allocator<int>_>::vector(&src,__l,(allocator_type *)&del);
  piVar2 = src.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (puVar3 = (uint *)src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; puVar3 != (uint *)piVar2;
      puVar3 = puVar3 + 1) {
    uVar1 = *puVar3;
    printf("\n\nINSERT %d:\n",(ulong)uVar1);
    storage::BTree::insert(&tree,uVar1,(Record *)0x0);
    storage::BTree::print(&tree);
  }
  local_58 = 0x1f;
  uStack_54 = 0x34;
  uStack_50 = 0x32;
  r = (Record *)0x120000000f;
  uStack_60 = 0x17;
  uStack_5c = 0x1e;
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)&r;
  std::vector<int,_std::allocator<int>_>::vector(&del,__l_00,&local_a9);
  for (puVar3 = (uint *)src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      puVar3 != (uint *)src.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
    uVar1 = *puVar3;
    printf("\n\nERASE %d:\n",(ulong)uVar1);
    r = (Record *)0x0;
    storage::BTree::erase(&tree,uVar1,&r);
    storage::BTree::print(&tree);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&del.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&src.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main0()
{
    storage::BTree tree;
    std::vector<int> src{18, 31, 12, 10, 15, 48, 45, 47, 50, 52, 23, 30, 20};
    for (auto it : src)
    {
        printf("\n\nINSERT %d:\n", it);
        tree.insert(it, nullptr);
        tree.print();
    }

    std::vector<int> del{15, 18, 23, 30, 31, 52, 50};
    for (auto it : src)
    {
        printf("\n\nERASE %d:\n", it);
        storage::Record *r = nullptr;
        tree.erase(it, r);
        tree.print();
    }
    return 0;
}